

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstSerialise.cpp
# Opt level: O0

string * __thiscall
enact::AstSerialise::visitSwitchExpr_abi_cxx11_
          (string *__return_storage_ptr__,AstSerialise *this,SwitchExpr *expr)

{
  bool bVar1;
  ostream *poVar2;
  type pEVar3;
  vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *this_00;
  type pattern;
  type expr_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  reference local_1f8;
  SwitchCase *case_;
  iterator __end1;
  iterator __begin1;
  vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_> *__range1;
  stringstream local_1a8 [8];
  stringstream s;
  ostream local_198 [376];
  SwitchExpr *local_20;
  SwitchExpr *expr_local;
  AstSerialise *this_local;
  
  local_20 = expr;
  expr_local = (SwitchExpr *)this;
  this_local = (AstSerialise *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
  poVar2 = std::operator<<(poVar2,"(Expr::Switch ");
  pEVar3 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                     (&local_20->value);
  ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  visitExpr((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1,
            &(this->
             super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ).
             super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ,pEVar3);
  poVar2 = std::operator<<(poVar2,(string *)&__range1);
  std::operator<<(poVar2," (\n");
  std::__cxx11::string::~string((string *)&__range1);
  std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
  this_00 = &local_20->cases;
  __end1 = std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::begin(this_00);
  case_ = (SwitchCase *)
          std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<enact::SwitchCase_*,_std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>_>
                                *)&case_);
    if (!bVar1) break;
    local_1f8 = __gnu_cxx::
                __normal_iterator<enact::SwitchCase_*,_std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>_>
                ::operator*(&__end1);
    poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
    poVar2 = std::operator<<(poVar2,"(");
    pattern = std::unique_ptr<enact::Pattern,_std::default_delete<enact::Pattern>_>::operator*
                        (&local_1f8->pattern);
    PatternVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::visitPattern(&local_218,
                   &(this->
                    super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).
                    super_PatternVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ,pattern);
    poVar2 = std::operator<<(poVar2,(string *)&local_218);
    poVar2 = std::operator<<(poVar2," ");
    pEVar3 = std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::operator*
                       (&local_1f8->predicate);
    ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    visitExpr(&local_238,
              &(this->
               super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,pEVar3);
    poVar2 = std::operator<<(poVar2,(string *)&local_238);
    std::operator<<(poVar2," (\n");
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::operator+=((string *)&this->m_ident,"    ");
    expr_00 = std::unique_ptr<enact::BlockExpr,_std::default_delete<enact::BlockExpr>_>::operator*
                        (&local_1f8->body);
    ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    visitExpr(&local_258,
              &(this->
               super_AstVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super_ExprVisitor<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ,&expr_00->super_Expr);
    std::operator<<(local_198,(string *)&local_258);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::erase((ulong)&this->m_ident,0);
    poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
    std::operator<<(poVar2,")\n");
    __gnu_cxx::
    __normal_iterator<enact::SwitchCase_*,_std::vector<enact::SwitchCase,_std::allocator<enact::SwitchCase>_>_>
    ::operator++(&__end1);
  }
  std::__cxx11::string::erase((ulong)&this->m_ident,0);
  poVar2 = std::operator<<(local_198,(string *)&this->m_ident);
  std::operator<<(poVar2,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string AstSerialise::visitSwitchExpr(SwitchExpr& expr) {
        std::stringstream s;

        s << m_ident << "(Expr::Switch " << visitExpr(*expr.value) << " (\n";
        m_ident += "    ";

        for (auto &case_ : expr.cases) {
            s << m_ident << "(" << visitPattern(*case_.pattern) << " " <<
                    visitExpr(*case_.predicate) << " (\n";
            m_ident += "    ";

            s << visitExpr(*case_.body);

            m_ident.erase(0, 4);
            s << m_ident << ")\n";
        }

        m_ident.erase(0, 4);
        s << m_ident << ")";

        return s.str();
    }